

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  CURLcode CVar4;
  size_t __n;
  size_t __n_00;
  char *buf;
  size_t sVar5;
  long lVar6;
  size_t __n_01;
  char *pcVar7;
  ulong __n_02;
  char *__s;
  undefined1 local_60 [5];
  undefined3 uStack_5b;
  undefined4 uStack_58;
  undefined1 uStack_54;
  CURLcode local_50;
  char remain [4];
  
  *done = false;
  remain[0] = '\0';
  remain[1] = '\0';
  remain[2] = '\0';
  remain[3] = '\0';
  uStack_58 = 0;
  uStack_54 = 0;
  local_60 = (undefined1  [5])0x6c727563;
  uStack_5b = 0;
  pcVar7 = (data->state).aptr.user;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  __n = strlen(pcVar7);
  __s = (data->state).aptr.passwd;
  if (__s == (char *)0x0) {
    __s = "";
  }
  __n_00 = strlen(__s);
  lVar6 = __n_00 + __n + (ulong)(__n != 0) * 2;
  iVar3 = mqtt_encode_len(remain,lVar6 + (ulong)(__n_00 != 0) * 2 + 0x18);
  __n_01 = (size_t)iVar3;
  __n_02 = lVar6 + (ulong)(__n_00 != 0) * 2 + __n_01 + 0x19;
  if (0xfffffff < __n_02) {
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
    goto LAB_0013f04e;
  }
  buf = (char *)(*Curl_cmalloc)(__n_02);
  if (buf == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
    goto LAB_0013f04e;
  }
  memset(buf,0,__n_02);
  *buf = '\x10';
  memcpy(buf + 1,remain,__n_01);
  pcVar1 = buf + __n_01 + 1;
  pcVar1[0] = '\0';
  pcVar1[1] = '\x04';
  pcVar1[2] = 'M';
  pcVar1[3] = 'Q';
  pcVar1[4] = 'T';
  pcVar1[5] = 'T';
  pcVar1[6] = '\x04';
  pcVar1[7] = '\x02';
  (buf + __n_01 + 9)[0] = '\0';
  (buf + __n_01 + 9)[1] = '<';
  local_50 = Curl_rand_alnum(data,local_60 + 4,9);
  sVar5 = strlen(local_60);
  if (sVar5 == 0xc) {
    (buf + __n_01 + 0xb)[0] = '\0';
    (buf + __n_01 + 0xb)[1] = '\f';
    *(undefined4 *)(buf + __n_01 + 0x15) = uStack_58;
    *(ulong *)(buf + __n_01 + 0xd) = CONCAT35(uStack_5b,local_60);
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Using client id \'%s\'",local_60);
    }
    lVar6 = __n + __n_01 + 0x19;
    if (__n == 0) {
LAB_0013efa4:
      CVar4 = local_50;
      if (__n_00 != 0) {
        if (0xffff < __n_00) {
          pcVar7 = "Password is too large: [%zu]";
          goto LAB_0013efca;
        }
        buf[__n_01 + 8] = buf[__n_01 + 8] | 0x40;
        buf[lVar6] = (char)(__n_00 >> 8);
        buf[lVar6 + 1] = (char)__n_00;
        memcpy(buf + lVar6 + 2,__s,__n_00);
      }
      if (CVar4 == CURLE_OK) {
        CVar4 = mqtt_send(data,buf,__n_02);
      }
    }
    else {
      if (__n < 0x10000) {
        buf[__n_01 + 8] = buf[__n_01 + 8] | 0x80;
        lVar6 = __n + __n_01 + 0x1b;
        buf[__n_01 + 0x19] = (char)(__n >> 8);
        buf[__n_01 + 0x1a] = (char)__n;
        memcpy(buf + __n_01 + 0x1b,pcVar7,__n);
        goto LAB_0013efa4;
      }
      pcVar7 = "Username is too large: [%zu]";
      __n_00 = __n;
LAB_0013efca:
      Curl_failf(data,pcVar7,__n_00);
      CVar4 = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Client ID length mismatched: [%zu]",sVar5);
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
  }
  (*Curl_cfree)(buf);
  (*Curl_cfree)((data->state).aptr.user);
  (data->state).aptr.user = (char *)0x0;
  (*Curl_cfree)((data->state).aptr.passwd);
  (data->state).aptr.passwd = (char *)0x0;
  if (CVar4 == CURLE_OK) {
    (data->conn->proto).ftpc.pp.nread_resp = 0x200000000;
    return CURLE_OK;
  }
LAB_0013f04e:
  Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)CVar4);
  return CVar4;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}